

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::MemPass::HasOnlySupportedRefs::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,Instruction *user)

{
  MemPass *this_00;
  bool bVar1;
  CommonDebugInfoInstructions CVar2;
  Op op_00;
  Op op;
  CommonDebugInfoInstructions dbg_op;
  Instruction *user_local;
  anon_class_8_1_8991fb9c *this_local;
  
  this_00 = this->this;
  CVar2 = Instruction::GetCommonDebugOpcode(user);
  if ((((CVar2 != CommonDebugInfoDebugDeclare) && (CVar2 != CommonDebugInfoDebugValue)) &&
      (op_00 = Instruction::opcode(user), op_00 != OpStore)) &&
     (((op_00 != OpLoad && (op_00 != OpName)) && (bVar1 = IsNonTypeDecorate(this_00,op_00), !bVar1))
     )) {
    return false;
  }
  return true;
}

Assistant:

bool MemPass::HasOnlySupportedRefs(uint32_t varId) {
  return get_def_use_mgr()->WhileEachUser(varId, [this](Instruction* user) {
    auto dbg_op = user->GetCommonDebugOpcode();
    if (dbg_op == CommonDebugInfoDebugDeclare ||
        dbg_op == CommonDebugInfoDebugValue) {
      return true;
    }
    spv::Op op = user->opcode();
    if (op != spv::Op::OpStore && op != spv::Op::OpLoad &&
        op != spv::Op::OpName && !IsNonTypeDecorate(op)) {
      return false;
    }
    return true;
  });
}